

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_FFDHE.c
# Opt level: O0

uint64_t Hacl_FFDHE_ffdhe_shared_secret(Spec_FFDHE_ffdhe_alg a,uint8_t *sk,uint8_t *pk,uint8_t *ss)

{
  uint uVar1;
  uint64_t *puVar2;
  uint8_t *ss_00;
  uint8_t *pk_00;
  uint8_t *sk_00;
  Spec_FFDHE_ffdhe_alg SVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint64_t uStack_60;
  uint64_t uStack_58;
  uint64_t *local_50;
  uint64_t m;
  unsigned_long __vla_expr0;
  int local_30;
  uint32_t local_2c;
  uint32_t nLen;
  uint32_t len;
  uint8_t *ss_local;
  uint8_t *pk_local;
  uint8_t *sk_local;
  Spec_FFDHE_ffdhe_alg a_local;
  
  uStack_60 = 0x24ccf3;
  _nLen = ss;
  ss_local = pk;
  pk_local = sk;
  sk_local._7_1_ = a;
  local_2c = ffdhe_len(a);
  local_30 = (local_2c - 1 >> 3) + 1;
  if (0x1fffffffffffffff < (ulong)(uint)(local_30 * 2)) {
    uStack_60 = 0x24cd36;
    printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
           "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_FFDHE.c"
           ,0x152);
    uStack_60 = 0x24cd40;
    exit(0xfd);
  }
  uVar4 = (ulong)(uint)(local_30 * 2);
  uVar1 = local_30 * 2;
  local_50 = &uStack_58 + -uVar4;
  m = uVar4;
  __vla_expr0 = (unsigned_long)&uStack_58;
  (&uStack_60)[-uVar4] = 0x24cd80;
  memset(&uStack_58 + -uVar4,0,(ulong)uVar1 << 3);
  SVar3 = sk_local._7_1_;
  puVar2 = local_50;
  (&uStack_60)[-uVar4] = 0x24cd8d;
  ffdhe_precomp_p(SVar3,puVar2);
  SVar3 = sk_local._7_1_;
  sk_00 = pk_local;
  pk_00 = ss_local;
  ss_00 = _nLen;
  puVar2 = local_50;
  (&uStack_60)[-uVar4] = 0x24cda8;
  uVar5 = Hacl_FFDHE_ffdhe_shared_secret_precomp(SVar3,puVar2,sk_00,pk_00,ss_00);
  return uVar5;
}

Assistant:

uint64_t
Hacl_FFDHE_ffdhe_shared_secret(Spec_FFDHE_ffdhe_alg a, uint8_t *sk, uint8_t *pk, uint8_t *ss)
{
  uint32_t len = ffdhe_len(a);
  uint32_t nLen = (len - 1U) / 8U + 1U;
  KRML_CHECK_SIZE(sizeof (uint64_t), nLen + nLen);
  uint64_t p_n[nLen + nLen];
  memset(p_n, 0U, (nLen + nLen) * sizeof (uint64_t));
  ffdhe_precomp_p(a, p_n);
  uint64_t m = Hacl_FFDHE_ffdhe_shared_secret_precomp(a, p_n, sk, pk, ss);
  return m;
}